

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::DirectConversion
               (Vector *vector,ArrowArray *array,ArrowScanLocalState *scan_state,
               int64_t nested_offset,uint64_t parent_offset)

{
  void *pvVar1;
  idx_t iVar2;
  long lVar3;
  
  iVar2 = GetTypeIdSize((vector->type).physical_type_);
  pvVar1 = array->buffers[1];
  lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
  lVar3 = lVar3 + array->offset + scan_state->chunk_offset;
  if (nested_offset != -1) {
    lVar3 = array->offset + nested_offset;
  }
  vector->data = (data_ptr_t)(lVar3 * iVar2 + (long)pvVar1);
  return;
}

Assistant:

static void DirectConversion(Vector &vector, ArrowArray &array, const ArrowScanLocalState &scan_state,
                             int64_t nested_offset, uint64_t parent_offset) {
	auto internal_type = GetTypeIdSize(vector.GetType().InternalType());
	auto data_ptr =
	    ArrowBufferData<data_t>(array, 1) +
	    internal_type * GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset), scan_state, nested_offset);
	FlatVector::SetData(vector, data_ptr);
}